

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O3

void __thiscall
UDPSplitPacketWriter::UDPSplitPacketWriter
          (UDPSplitPacketWriter *this,Socket *socket,uint16_t id,int mtu,int buf_size)

{
  sockfd_t sVar1;
  buf_t *pbVar2;
  ulong uVar3;
  
  sVar1 = socket->sockfd;
  *(undefined ***)&this->field_0x30 = &PTR___cxa_pure_virtual_0011ac70;
  (this->super_BufferWriter).super_Buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_00119ec0;
  uVar3 = 0xffffffffffffffff;
  if (-1 < buf_size) {
    uVar3 = (long)buf_size;
  }
  pbVar2 = (buf_t *)operator_new__(uVar3);
  (this->super_BufferWriter).super_Buffer.buf_start = pbVar2;
  (this->super_BufferWriter).super_Buffer.buf_end = pbVar2 + buf_size;
  (this->super_BufferWriter).super_Buffer._vptr_Buffer = (_func_int **)0x11a3a8;
  *(undefined8 *)&this->field_0x30 = 0x11a3f8;
  *(int *)&(this->super_BufferWriter).field_0x24 = mtu;
  this->id = id;
  *(sockfd_t *)&(this->super_BufferWriter).field_0x20 = sVar1;
  this->count = 0;
  (this->super_BufferWriter).super_Buffer.buf_current = pbVar2 + 4;
  return;
}

Assistant:

UDPSplitPacketWriter::UDPSplitPacketWriter(Socket::sockfd_t socket, uint16_t id, int mtu, int buf_size) : BufferWriter(buf_size) {
  this->mtu = mtu;
  this->id = id;
  this->socket = socket;
  count = 0;
  buf_current += sizeof(id) + sizeof(count);
}